

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.h
# Opt level: O1

void __thiscall
cnn::Tensor::load<boost::archive::text_iarchive>(Tensor *this,text_iarchive *ar,uint param_2)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined8 uVar4;
  byte bVar5;
  byte bVar6;
  float *t;
  ulong uVar7;
  uint uVar8;
  void *x;
  ulong uVar9;
  ushort uVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  int iVar19;
  int iVar20;
  
  boost::serialization::
  singleton<boost::archive::detail::iserializer<boost::archive::text_iarchive,_cnn::Dim>_>::
  get_instance();
  boost::archive::detail::basic_iarchive::load_object(ar,(basic_iserializer *)this);
  uVar9 = (ulong)(this->d).nd;
  iVar20 = 1;
  iVar19 = 1;
  if (uVar9 != 0) {
    auVar12 = vpbroadcastq_avx512f();
    auVar13 = vpbroadcastd_avx512f(ZEXT416(1));
    uVar7 = 0;
    auVar14 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar15 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar16 = vmovdqa64_avx512f(auVar13);
      auVar13 = vpbroadcastq_avx512f();
      auVar17 = vporq_avx512f(auVar13,auVar14);
      auVar13 = vporq_avx512f(auVar13,auVar15);
      uVar4 = vpcmpuq_avx512f(auVar13,auVar12,2);
      bVar5 = (byte)uVar4;
      uVar4 = vpcmpuq_avx512f(auVar17,auVar12,2);
      bVar6 = (byte)uVar4;
      uVar10 = CONCAT11(bVar6,bVar5);
      auVar13 = vmovdqu32_avx512f(*(undefined1 (*) [64])((this->d).d + uVar7));
      auVar17._4_4_ = (uint)((byte)(uVar10 >> 1) & 1) * auVar13._4_4_;
      auVar17._0_4_ = (uint)(bVar5 & 1) * auVar13._0_4_;
      auVar17._8_4_ = (uint)((byte)(uVar10 >> 2) & 1) * auVar13._8_4_;
      auVar17._12_4_ = (uint)((byte)(uVar10 >> 3) & 1) * auVar13._12_4_;
      auVar17._16_4_ = (uint)((byte)(uVar10 >> 4) & 1) * auVar13._16_4_;
      auVar17._20_4_ = (uint)((byte)(uVar10 >> 5) & 1) * auVar13._20_4_;
      auVar17._24_4_ = (uint)((byte)(uVar10 >> 6) & 1) * auVar13._24_4_;
      auVar17._28_4_ = (uint)((byte)(uVar10 >> 7) & 1) * auVar13._28_4_;
      auVar17._32_4_ = (uint)(bVar6 & 1) * auVar13._32_4_;
      auVar17._36_4_ = (uint)(bVar6 >> 1 & 1) * auVar13._36_4_;
      auVar17._40_4_ = (uint)(bVar6 >> 2 & 1) * auVar13._40_4_;
      auVar17._44_4_ = (uint)(bVar6 >> 3 & 1) * auVar13._44_4_;
      auVar17._48_4_ = (uint)(bVar6 >> 4 & 1) * auVar13._48_4_;
      auVar17._52_4_ = (uint)(bVar6 >> 5 & 1) * auVar13._52_4_;
      auVar17._56_4_ = (uint)(bVar6 >> 6 & 1) * auVar13._56_4_;
      auVar17._60_4_ = (uint)(bVar6 >> 7) * auVar13._60_4_;
      auVar13 = vpmulld_avx512f(auVar17,auVar16);
      uVar7 = uVar7 + 0x10;
    } while ((uVar9 + 0xf & 0x1fffffff0) != uVar7);
    auVar12 = vmovdqa32_avx512f(auVar13);
    auVar13._0_4_ = (uint)(bVar5 & 1) * auVar12._0_4_ | (uint)!(bool)(bVar5 & 1) * auVar16._0_4_;
    bVar1 = (bool)((byte)(uVar10 >> 1) & 1);
    auVar13._4_4_ = (uint)bVar1 * auVar12._4_4_ | (uint)!bVar1 * auVar16._4_4_;
    bVar1 = (bool)((byte)(uVar10 >> 2) & 1);
    auVar13._8_4_ = (uint)bVar1 * auVar12._8_4_ | (uint)!bVar1 * auVar16._8_4_;
    bVar1 = (bool)((byte)(uVar10 >> 3) & 1);
    auVar13._12_4_ = (uint)bVar1 * auVar12._12_4_ | (uint)!bVar1 * auVar16._12_4_;
    bVar1 = (bool)((byte)(uVar10 >> 4) & 1);
    auVar13._16_4_ = (uint)bVar1 * auVar12._16_4_ | (uint)!bVar1 * auVar16._16_4_;
    bVar1 = (bool)((byte)(uVar10 >> 5) & 1);
    auVar13._20_4_ = (uint)bVar1 * auVar12._20_4_ | (uint)!bVar1 * auVar16._20_4_;
    bVar1 = (bool)((byte)(uVar10 >> 6) & 1);
    auVar13._24_4_ = (uint)bVar1 * auVar12._24_4_ | (uint)!bVar1 * auVar16._24_4_;
    bVar1 = (bool)((byte)(uVar10 >> 7) & 1);
    auVar13._28_4_ = (uint)bVar1 * auVar12._28_4_ | (uint)!bVar1 * auVar16._28_4_;
    auVar13._32_4_ = (uint)(bVar6 & 1) * auVar12._32_4_ | (uint)!(bool)(bVar6 & 1) * auVar16._32_4_;
    bVar1 = (bool)(bVar6 >> 1 & 1);
    auVar13._36_4_ = (uint)bVar1 * auVar12._36_4_ | (uint)!bVar1 * auVar16._36_4_;
    bVar1 = (bool)(bVar6 >> 2 & 1);
    auVar13._40_4_ = (uint)bVar1 * auVar12._40_4_ | (uint)!bVar1 * auVar16._40_4_;
    bVar1 = (bool)(bVar6 >> 3 & 1);
    auVar13._44_4_ = (uint)bVar1 * auVar12._44_4_ | (uint)!bVar1 * auVar16._44_4_;
    bVar1 = (bool)(bVar6 >> 4 & 1);
    auVar13._48_4_ = (uint)bVar1 * auVar12._48_4_ | (uint)!bVar1 * auVar16._48_4_;
    bVar1 = (bool)(bVar6 >> 5 & 1);
    auVar13._52_4_ = (uint)bVar1 * auVar12._52_4_ | (uint)!bVar1 * auVar16._52_4_;
    bVar1 = (bool)(bVar6 >> 6 & 1);
    auVar13._56_4_ = (uint)bVar1 * auVar12._56_4_ | (uint)!bVar1 * auVar16._56_4_;
    auVar13._60_4_ =
         (uint)(bVar6 >> 7) * auVar12._60_4_ | (uint)!(bool)(bVar6 >> 7) * auVar16._60_4_;
    auVar11 = vextracti64x4_avx512f(auVar13,1);
    auVar12 = vpmulld_avx512f(auVar13,ZEXT3264(auVar11));
    auVar2 = vpmulld_avx(auVar12._0_16_,auVar12._16_16_);
    auVar3 = vpshufd_avx(auVar2,0xee);
    auVar2 = vpmulld_avx(auVar2,auVar3);
    auVar3 = vpshufd_avx(auVar2,0x55);
    auVar2 = vpmulld_avx(auVar2,auVar3);
    iVar19 = auVar2._0_4_;
  }
  t = (float *)cnn_mm_malloc((ulong)(iVar19 * (this->d).bd) << 2,0x20);
  this->v = t;
  uVar9 = (ulong)(this->d).nd;
  if (uVar9 != 0) {
    auVar12 = vpbroadcastq_avx512f();
    auVar13 = vpbroadcastd_avx512f(ZEXT416(1));
    uVar7 = 0;
    auVar14 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar15 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar16 = vmovdqa64_avx512f(auVar13);
      auVar13 = vpbroadcastq_avx512f();
      auVar17 = vporq_avx512f(auVar13,auVar14);
      auVar13 = vporq_avx512f(auVar13,auVar15);
      uVar4 = vpcmpuq_avx512f(auVar13,auVar12,2);
      bVar5 = (byte)uVar4;
      uVar4 = vpcmpuq_avx512f(auVar17,auVar12,2);
      bVar6 = (byte)uVar4;
      uVar10 = CONCAT11(bVar6,bVar5);
      auVar13 = vmovdqu32_avx512f(*(undefined1 (*) [64])((this->d).d + uVar7));
      auVar18._4_4_ = (uint)((byte)(uVar10 >> 1) & 1) * auVar13._4_4_;
      auVar18._0_4_ = (uint)(bVar5 & 1) * auVar13._0_4_;
      auVar18._8_4_ = (uint)((byte)(uVar10 >> 2) & 1) * auVar13._8_4_;
      auVar18._12_4_ = (uint)((byte)(uVar10 >> 3) & 1) * auVar13._12_4_;
      auVar18._16_4_ = (uint)((byte)(uVar10 >> 4) & 1) * auVar13._16_4_;
      auVar18._20_4_ = (uint)((byte)(uVar10 >> 5) & 1) * auVar13._20_4_;
      auVar18._24_4_ = (uint)((byte)(uVar10 >> 6) & 1) * auVar13._24_4_;
      auVar18._28_4_ = (uint)((byte)(uVar10 >> 7) & 1) * auVar13._28_4_;
      auVar18._32_4_ = (uint)(bVar6 & 1) * auVar13._32_4_;
      auVar18._36_4_ = (uint)(bVar6 >> 1 & 1) * auVar13._36_4_;
      auVar18._40_4_ = (uint)(bVar6 >> 2 & 1) * auVar13._40_4_;
      auVar18._44_4_ = (uint)(bVar6 >> 3 & 1) * auVar13._44_4_;
      auVar18._48_4_ = (uint)(bVar6 >> 4 & 1) * auVar13._48_4_;
      auVar18._52_4_ = (uint)(bVar6 >> 5 & 1) * auVar13._52_4_;
      auVar18._56_4_ = (uint)(bVar6 >> 6 & 1) * auVar13._56_4_;
      auVar18._60_4_ = (uint)(bVar6 >> 7) * auVar13._60_4_;
      auVar13 = vpmulld_avx512f(auVar18,auVar16);
      uVar7 = uVar7 + 0x10;
    } while ((uVar9 + 0xf & 0x1fffffff0) != uVar7);
    auVar12 = vmovdqa32_avx512f(auVar13);
    auVar14._0_4_ = (uint)(bVar5 & 1) * auVar12._0_4_ | (uint)!(bool)(bVar5 & 1) * auVar16._0_4_;
    bVar1 = (bool)((byte)(uVar10 >> 1) & 1);
    auVar14._4_4_ = (uint)bVar1 * auVar12._4_4_ | (uint)!bVar1 * auVar16._4_4_;
    bVar1 = (bool)((byte)(uVar10 >> 2) & 1);
    auVar14._8_4_ = (uint)bVar1 * auVar12._8_4_ | (uint)!bVar1 * auVar16._8_4_;
    bVar1 = (bool)((byte)(uVar10 >> 3) & 1);
    auVar14._12_4_ = (uint)bVar1 * auVar12._12_4_ | (uint)!bVar1 * auVar16._12_4_;
    bVar1 = (bool)((byte)(uVar10 >> 4) & 1);
    auVar14._16_4_ = (uint)bVar1 * auVar12._16_4_ | (uint)!bVar1 * auVar16._16_4_;
    bVar1 = (bool)((byte)(uVar10 >> 5) & 1);
    auVar14._20_4_ = (uint)bVar1 * auVar12._20_4_ | (uint)!bVar1 * auVar16._20_4_;
    bVar1 = (bool)((byte)(uVar10 >> 6) & 1);
    auVar14._24_4_ = (uint)bVar1 * auVar12._24_4_ | (uint)!bVar1 * auVar16._24_4_;
    bVar1 = (bool)((byte)(uVar10 >> 7) & 1);
    auVar14._28_4_ = (uint)bVar1 * auVar12._28_4_ | (uint)!bVar1 * auVar16._28_4_;
    auVar14._32_4_ = (uint)(bVar6 & 1) * auVar12._32_4_ | (uint)!(bool)(bVar6 & 1) * auVar16._32_4_;
    bVar1 = (bool)(bVar6 >> 1 & 1);
    auVar14._36_4_ = (uint)bVar1 * auVar12._36_4_ | (uint)!bVar1 * auVar16._36_4_;
    bVar1 = (bool)(bVar6 >> 2 & 1);
    auVar14._40_4_ = (uint)bVar1 * auVar12._40_4_ | (uint)!bVar1 * auVar16._40_4_;
    bVar1 = (bool)(bVar6 >> 3 & 1);
    auVar14._44_4_ = (uint)bVar1 * auVar12._44_4_ | (uint)!bVar1 * auVar16._44_4_;
    bVar1 = (bool)(bVar6 >> 4 & 1);
    auVar14._48_4_ = (uint)bVar1 * auVar12._48_4_ | (uint)!bVar1 * auVar16._48_4_;
    bVar1 = (bool)(bVar6 >> 5 & 1);
    auVar14._52_4_ = (uint)bVar1 * auVar12._52_4_ | (uint)!bVar1 * auVar16._52_4_;
    bVar1 = (bool)(bVar6 >> 6 & 1);
    auVar14._56_4_ = (uint)bVar1 * auVar12._56_4_ | (uint)!bVar1 * auVar16._56_4_;
    auVar14._60_4_ =
         (uint)(bVar6 >> 7) * auVar12._60_4_ | (uint)!(bool)(bVar6 >> 7) * auVar16._60_4_;
    auVar11 = vextracti64x4_avx512f(auVar14,1);
    auVar12 = vpmulld_avx512f(auVar14,ZEXT3264(auVar11));
    auVar2 = vpmulld_avx(auVar12._0_16_,auVar12._16_16_);
    auVar3 = vpshufd_avx(auVar2,0xee);
    auVar2 = vpmulld_avx(auVar2,auVar3);
    auVar3 = vpshufd_avx(auVar2,0x55);
    auVar2 = vpmulld_avx(auVar2,auVar3);
    iVar20 = auVar2._0_4_;
  }
  uVar8 = iVar20 * (this->d).bd;
  if (uVar8 != 0) {
    uVar9 = (ulong)uVar8;
    do {
      boost::archive::basic_text_iprimitive<std::basic_istream<char,_std::char_traits<char>_>_>::
      load<float>((basic_text_iprimitive<std::basic_istream<char,_std::char_traits<char>_>_> *)
                  &ar->field_0x28,t);
      uVar9 = uVar9 - 1;
      t = t + 1;
    } while (uVar9 != 0);
  }
  return;
}

Assistant:

void load(Archive& ar, const unsigned int) {
    ar & d;
#if HAVE_CUDA
    CUDA_CHECK(cudaMalloc(&v, d.size() * sizeof(float)));
    float* vc = static_cast<float*>(std::malloc(d.size() * sizeof(float)));
    ar & boost::serialization::make_array(vc, d.size());
    CUDA_CHECK(cudaMemcpyAsync(v, vc, d.size() * sizeof(float), cudaMemcpyHostToDevice));
#else
    v = static_cast<float*>(cnn_mm_malloc(d.size() * sizeof(float), 32));
    ar & boost::serialization::make_array(v, d.size());
#endif
  }